

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

uint32_t av1_get_crc_value(CRC_CALCULATOR *p_crc_calculator,uint8_t *p,int length)

{
  uint32_t uVar1;
  uint32_t in_EDX;
  uint8_t *in_RSI;
  CRC_CALCULATOR *in_RDI;
  
  crc_calculator_reset(in_RDI);
  crc_calculator_process_data(in_RDI,in_RSI,in_EDX);
  uVar1 = crc_calculator_get_crc(in_RDI);
  return uVar1;
}

Assistant:

uint32_t av1_get_crc_value(CRC_CALCULATOR *p_crc_calculator, uint8_t *p,
                           int length) {
  crc_calculator_reset(p_crc_calculator);
  crc_calculator_process_data(p_crc_calculator, p, length);
  return crc_calculator_get_crc(p_crc_calculator);
}